

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O0

ANNbool readPt(istream *in,int *p,int dim)

{
  long *plVar1;
  ulong uVar2;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  int i;
  int local_20;
  
  local_20 = 0;
  while( true ) {
    if (in_EDX <= local_20) {
      return ANNtrue;
    }
    plVar1 = (long *)std::istream::operator>>(in_RDI,(int *)(in_RSI + (long)local_20 * 4));
    uVar2 = std::ios::operator!((ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    if ((uVar2 & 1) != 0) break;
    local_20 = local_20 + 1;
  }
  return ANNfalse;
}

Assistant:

ANNbool readPt(istream &in, int *p, int dim)  
{
    for (int i = 0; i < dim; i++) {
        if (!(in >> p[i])) return ANNfalse;
    }
    return ANNtrue;
}